

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::MasteringMetadata::SetChromaticity
          (MasteringMetadata *this,PrimaryChromaticity *r,PrimaryChromaticity *g,
          PrimaryChromaticity *b,PrimaryChromaticity *white_point)

{
  pointer pPVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  PrimaryChromaticityPtr wp_ptr;
  PrimaryChromaticityPtr b_ptr;
  PrimaryChromaticityPtr g_ptr;
  PrimaryChromaticityPtr r_ptr;
  nullptr_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  PrimaryChromaticityPtr *in_stack_ffffffffffffffc0;
  PrimaryChromaticity *in_stack_ffffffffffffffc8;
  bool local_1;
  
  std::unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>
  ::unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
            ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
              *)CONCAT17(in_stack_ffffffffffffff97,
                         CONCAT16(in_stack_ffffffffffffff96,
                                  CONCAT15(in_stack_ffffffffffffff95,
                                           CONCAT14(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90)))),
             in_stack_ffffffffffffff88);
  if ((in_RSI == 0) ||
     (in_stack_ffffffffffffff97 =
           anon_unknown_12::CopyChromaticity(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
     (bool)in_stack_ffffffffffffff97)) {
    std::
    unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>::
    unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
              ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                *)CONCAT17(in_stack_ffffffffffffff97,
                           CONCAT16(in_stack_ffffffffffffff96,
                                    CONCAT15(in_stack_ffffffffffffff95,
                                             CONCAT14(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90)))),
               in_stack_ffffffffffffff88);
    if ((in_RDX == 0) ||
       (in_stack_ffffffffffffff96 =
             anon_unknown_12::CopyChromaticity(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
       (bool)in_stack_ffffffffffffff96)) {
      std::
      unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>::
      unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
                ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                  *)CONCAT17(in_stack_ffffffffffffff97,
                             CONCAT16(in_stack_ffffffffffffff96,
                                      CONCAT15(in_stack_ffffffffffffff95,
                                               CONCAT14(in_stack_ffffffffffffff94,
                                                        in_stack_ffffffffffffff90)))),
                 in_stack_ffffffffffffff88);
      if ((in_RCX == 0) ||
         (in_stack_ffffffffffffff95 =
               anon_unknown_12::CopyChromaticity
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
         (bool)in_stack_ffffffffffffff95)) {
        std::
        unique_ptr<mkvmuxer::PrimaryChromaticity,std::default_delete<mkvmuxer::PrimaryChromaticity>>
        ::unique_ptr<std::default_delete<mkvmuxer::PrimaryChromaticity>,void>
                  ((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                    *)CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,
                                        CONCAT15(in_stack_ffffffffffffff95,
                                                 CONCAT14(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90)))),
                   in_stack_ffffffffffffff88);
        if ((in_R8 == 0) ||
           (in_stack_ffffffffffffff94 =
                 anon_unknown_12::CopyChromaticity
                           (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0),
           (bool)in_stack_ffffffffffffff94)) {
          pPVar1 = std::
                   unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                   ::release((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                              *)0x172d68);
          *(pointer *)(in_RDI + 8) = pPVar1;
          pPVar1 = std::
                   unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                   ::release((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                              *)0x172d7e);
          *(pointer *)(in_RDI + 0x10) = pPVar1;
          pPVar1 = std::
                   unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                   ::release((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                              *)0x172d94);
          *(pointer *)(in_RDI + 0x18) = pPVar1;
          pPVar1 = std::
                   unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                   ::release((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                              *)0x172daa);
          *(pointer *)(in_RDI + 0x20) = pPVar1;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
        std::
        unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
        ::~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                       *)CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,
                                           CONCAT15(in_stack_ffffffffffffff95,
                                                    CONCAT14(in_stack_ffffffffffffff94,
                                                             in_stack_ffffffffffffff90)))));
      }
      else {
        local_1 = false;
      }
      std::
      unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
      ::~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                     *)CONCAT17(in_stack_ffffffffffffff97,
                                CONCAT16(in_stack_ffffffffffffff96,
                                         CONCAT15(in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))));
    }
    else {
      local_1 = false;
    }
    std::
    unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
    ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
                 *)CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,
                                     CONCAT15(in_stack_ffffffffffffff95,
                                              CONCAT14(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90)))));
  }
  else {
    local_1 = false;
  }
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
               *)CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,
                                   CONCAT15(in_stack_ffffffffffffff95,
                                            CONCAT14(in_stack_ffffffffffffff94,
                                                     in_stack_ffffffffffffff90)))));
  return local_1;
}

Assistant:

bool MasteringMetadata::SetChromaticity(
    const PrimaryChromaticity* r, const PrimaryChromaticity* g,
    const PrimaryChromaticity* b, const PrimaryChromaticity* white_point) {
  PrimaryChromaticityPtr r_ptr(nullptr);
  if (r) {
    if (!CopyChromaticity(r, &r_ptr))
      return false;
  }
  PrimaryChromaticityPtr g_ptr(nullptr);
  if (g) {
    if (!CopyChromaticity(g, &g_ptr))
      return false;
  }
  PrimaryChromaticityPtr b_ptr(nullptr);
  if (b) {
    if (!CopyChromaticity(b, &b_ptr))
      return false;
  }
  PrimaryChromaticityPtr wp_ptr(nullptr);
  if (white_point) {
    if (!CopyChromaticity(white_point, &wp_ptr))
      return false;
  }

  r_ = r_ptr.release();
  g_ = g_ptr.release();
  b_ = b_ptr.release();
  white_point_ = wp_ptr.release();
  return true;
}